

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

optional<std::basic_string_view<char,_std::char_traits<char>_>_> * __thiscall
slang::ast::ElabSystemTaskSymbol::getMessage
          (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *__return_storage_ptr__,
          ElabSystemTaskSymbol *this)

{
  long lVar1;
  Scope *pSVar2;
  Compilation *this_00;
  SyntaxNode *this_01;
  Type *args_00;
  char *pcVar3;
  undefined7 uVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar8;
  ExpressionSyntax *pEVar9;
  undefined4 extraout_var;
  long lVar10;
  ulong uVar11;
  __extent_storage<18446744073709551615UL> in_R8;
  pointer ppEVar12;
  ASTContext *pAVar13;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> args_01;
  LookupLocation LVar14;
  SourceRange sourceRange;
  SmallVector<const_slang::ast::Expression_*,_5UL> args;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_d8;
  __index_type local_b8;
  Expression *local_b0;
  undefined1 local_a8 [56];
  ASTContext *local_70;
  pointer local_68;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_60 [3];
  
  if (this->resolved == true) {
    uVar4 = *(undefined7 *)
             &(this->message).
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              field_0x11;
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_engaged = (this->message).
                 super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                 ._M_engaged;
    *(undefined7 *)
     &(__return_storage_ptr__->
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      field_0x11 = uVar4;
    pcVar3 = (this->message).
             super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
             _M_payload._M_value._M_str;
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_len =
         (this->message).
         super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
         _M_payload.
         super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
         _M_payload._M_value._M_len;
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_str = pcVar3;
    return __return_storage_ptr__;
  }
  this->resolved = true;
  lVar1 = *(long *)((this->super_Symbol).originatingSyntax + 4);
  if (lVar1 == 0) {
    if ((this->message).
        super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_engaged == false) {
      (this->message).
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_engaged = true;
    }
    (this->message).
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_len = 0;
    (this->message).
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_str = "";
    uVar4 = *(undefined7 *)
             &(this->message).
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              field_0x11;
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_engaged = (this->message).
                 super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                 ._M_engaged;
    *(undefined7 *)
     &(__return_storage_ptr__->
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      field_0x11 = uVar4;
    pcVar3 = (this->message).
             super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
             _M_payload._M_value._M_str;
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_len =
         (this->message).
         super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
         _M_payload.
         super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
         _M_payload._M_value._M_len;
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_str = pcVar3;
    return __return_storage_ptr__;
  }
  pSVar2 = (this->super_Symbol).parentScope;
  this_00 = pSVar2->compilation;
  LVar14 = LookupLocation::before(&this->super_Symbol);
  local_a8._8_4_ = LVar14.index;
  local_a8._16_8_ = (char *)0x0;
  local_a8._24_8_ = (SourceLocation)0x0;
  local_a8._32_8_ = (TempVarSymbol *)0x0;
  local_a8._40_8_ = (RandomizeDetails *)0x0;
  local_a8._48_8_ = (AssertionInstanceDetails *)0x0;
  local_70 = (ASTContext *)((long)&local_60[0]._M_value + 8);
  local_68 = (pointer)0x0;
  local_60[0]._M_value._M_len = 5;
  uVar11 = *(long *)(lVar1 + 0x58) + 1;
  ppEVar12 = (pointer)0x0;
  pAVar13 = local_70;
  local_a8._0_8_ = pSVar2;
  if (1 < uVar11) {
    uVar11 = uVar11 >> 1;
    lVar10 = 0;
    do {
      ppSVar8 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           (*(long *)(lVar1 + 0x50) + lVar10));
      this_01 = *ppSVar8;
      if (this_01->kind == EmptyArgument) {
        args_00 = this_00->voidType;
        local_d8._M_rest._0_16_ = (undefined1  [16])slang::syntax::SyntaxNode::sourceRange(this_01);
        local_b0 = &BumpAllocator::
                    emplace<slang::ast::EmptyArgumentExpression,slang::ast::Type_const&,slang::SourceRange>
                              (&this_00->super_BumpAllocator,args_00,(SourceRange *)&local_d8)->
                    super_Expression;
        SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                  ((SmallVectorBase<slang::ast::Expression_const*> *)&local_70,&local_b0);
      }
      else {
        if (this_01->kind != OrderedArgument) {
          sourceRange = slang::syntax::SyntaxNode::sourceRange(this_01);
          ASTContext::addDiag((ASTContext *)local_a8,(DiagCode)0x790007,sourceRange);
          goto LAB_001fa377;
        }
        pEVar9 = ASTContext::requireSimpleExpr
                           ((ASTContext *)local_a8,*(PropertyExprSyntax **)(this_01 + 1));
        if (pEVar9 == (ExpressionSyntax *)0x0) goto LAB_001fa377;
        iVar7 = Expression::bind((int)pEVar9,(sockaddr *)local_a8,0);
        auVar5 = local_d8._M_rest._0_16_;
        local_d8._4_4_ = extraout_var;
        local_d8._0_4_ = iVar7;
        local_d8._8_8_ = auVar5._8_8_;
        SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                  ((SmallVectorBase<slang::ast::Expression_const*> *)&local_70,
                   (Expression **)&local_d8);
      }
      bVar6 = Expression::bad(*(Expression **)((long)local_70 + (long)local_68 * 8 + -8));
      ppEVar12 = local_68;
      pAVar13 = local_70;
      if (bVar6) goto LAB_001fa377;
      lVar10 = lVar10 + 0x30;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
    if (local_68 != (pointer)0x0) {
      if (this->taskKind == StaticAssert) {
        bVar6 = ASTContext::requireBooleanConvertible
                          ((ASTContext *)local_a8,(Expression *)(local_70->scope).ptr);
        if (bVar6) {
          ASTContext::eval((ConstantValue *)&local_d8,(ASTContext *)local_a8,
                           (Expression *)(pAVar13->scope).ptr,(bitmask<slang::ast::EvalFlags>)0x0);
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&local_d8);
          if (local_b8 != '\0') {
            this->assertCondition = (Expression *)(pAVar13->scope).ptr;
LAB_001fa3f1:
            ppEVar12 = (pointer)((long)ppEVar12 + -1);
            pAVar13 = (ASTContext *)&pAVar13->lookupIndex;
            goto LAB_001fa1db;
          }
        }
      }
      else {
        if (this->taskKind != Fatal) goto LAB_001fa1db;
        bVar6 = FmtHelpers::checkFinishNum
                          ((ASTContext *)local_a8,(Expression *)(local_70->scope).ptr);
        if (bVar6) goto LAB_001fa3f1;
      }
LAB_001fa377:
      (__return_storage_ptr__->
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_engaged = false;
      goto LAB_001fa37f;
    }
    ppEVar12 = (pointer)0x0;
  }
LAB_001fa1db:
  args_01._M_extent._M_extent_value = in_R8._M_extent_value;
  args_01._M_ptr = ppEVar12;
  createMessage((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_d8,
                (ElabSystemTaskSymbol *)local_a8,pAVar13,args_01);
  *(undefined8 *)
   &(this->message).
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_engaged = local_d8._16_8_;
  (this->message).
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = local_d8._0_8_;
  (this->message).
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = (char *)local_d8._8_8_;
  uVar4 = *(undefined7 *)
           &(this->message).
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            field_0x11;
  (__return_storage_ptr__->
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_engaged = (this->message).
               super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
               _M_engaged;
  *(undefined7 *)
   &(__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    field_0x11 = uVar4;
  pcVar3 = (this->message).
           super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
           _M_payload.
           super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
           _M_payload._M_value._M_str;
  (__return_storage_ptr__->
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_len =
       (this->message).
       super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
       _M_payload.
       super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
       _M_payload._M_value._M_len;
  (__return_storage_ptr__->
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_str = pcVar3;
LAB_001fa37f:
  if (local_70 != (ASTContext *)((long)&local_60[0]._M_value + 8)) {
    operator_delete(local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string_view> ElabSystemTaskSymbol::getMessage() const {
    if (resolved)
        return message;

    resolved = true;

    auto syntax = getSyntax();
    SLANG_ASSERT(syntax);

    auto argSyntax = syntax->as<ElabSystemTaskSyntax>().arguments;
    if (!argSyntax) {
        message = "";
        return message;
    }

    auto scope = getParentScope();
    SLANG_ASSERT(scope);

    // Bind all arguments.
    auto& comp = scope->getCompilation();
    ASTContext astCtx(*scope, LookupLocation::before(*this));
    SmallVector<const Expression*> args;
    for (auto arg : argSyntax->parameters) {
        switch (arg->kind) {
            case SyntaxKind::OrderedArgument: {
                const auto& oa = arg->as<OrderedArgumentSyntax>();
                if (auto exSyn = astCtx.requireSimpleExpr(*oa.expr))
                    args.push_back(&Expression::bind(*exSyn, astCtx));
                else
                    return {};
                break;
            }
            case SyntaxKind::NamedArgument:
                astCtx.addDiag(diag::NamedArgNotAllowed, arg->sourceRange());
                return {};
            case SyntaxKind::EmptyArgument:
                args.push_back(
                    comp.emplace<EmptyArgumentExpression>(comp.getVoidType(), arg->sourceRange()));
                break;
            default:
                SLANG_UNREACHABLE;
        }

        if (args.back()->bad())
            return {};
    }

    std::span<const Expression* const> argSpan = args;
    if (!argSpan.empty()) {
        if (taskKind == ElabSystemTaskKind::Fatal) {
            // If this is a $fatal task, check the finish number. We don't use this
            // for anything, but enforce that it's 0, 1, or 2.
            if (!FmtHelpers::checkFinishNum(astCtx, *argSpan[0]))
                return {};

            argSpan = argSpan.subspan(1);
        }
        else if (taskKind == ElabSystemTaskKind::StaticAssert) {
            // The first argument is the condition to check.
            if (!astCtx.requireBooleanConvertible(*argSpan[0]) || !astCtx.eval(*argSpan[0]))
                return {};

            assertCondition = argSpan[0];
            argSpan = argSpan.subspan(1);
        }
    }

    message = createMessage(astCtx, argSpan);
    return message;
}